

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  char local_49;
  XmlEncode local_48;
  
  if ((name->_M_string_length != 0) && (attribute->_M_string_length != 0)) {
    local_48.m_str._M_dataplus._M_p._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this->m_os,(char *)&local_48,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
    paVar1 = &local_48.m_str.field_2;
    pcVar2 = (attribute->_M_dataplus)._M_p;
    local_48.m_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + attribute->_M_string_length);
    local_48.m_forWhat = ForAttributes;
    XmlEncode::encodeTo(&local_48,(ostream *)poVar3);
    local_49 = '\"';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.m_str._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.m_str._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, std::string const& attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }